

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_f2a380::HandleReadSymlinkCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  Status SVar2;
  bool bVar3;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view value;
  string result;
  string local_90;
  string local_70;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_50;
  size_type local_38;
  pointer local_30;
  undefined8 local_28;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x60) {
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    SVar2 = cmsys::SystemTools::ReadSymlink(pbVar1 + 1,&local_90);
    bVar3 = SVar2.Kind_ == Success;
    if (bVar3) {
      value._M_str = local_90._M_dataplus._M_p;
      value._M_len = local_90._M_string_length;
      cmMakefile::AddDefinition(status->Makefile,pbVar1 + 2,value);
    }
    else {
      local_50.first._M_len = 0x38;
      local_50.first._M_str = "READ_SYMLINK requested of path that is not a symlink:\n  ";
      local_50.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_30 = pbVar1[1]._M_dataplus._M_p;
      local_38 = pbVar1[1]._M_string_length;
      local_28 = 0;
      views._M_len = 2;
      views._M_array = &local_50;
      cmCatViews(&local_70,views);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    local_50.first._M_str = (pbVar1->_M_dataplus)._M_p;
    local_50.first._M_len = pbVar1->_M_string_length;
    local_50.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_38 = 0x29;
    local_30 = " requires a file name and output variable";
    local_28 = 0;
    views_00._M_len = 2;
    views_00._M_array = &local_50;
    cmCatViews(&local_90,views_00);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool HandleReadSymlinkCommand(std::vector<std::string> const& args,
                              cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError(
      cmStrCat(args[0], " requires a file name and output variable"));
    return false;
  }

  const std::string& filename = args[1];
  const std::string& outputVariable = args[2];

  std::string result;
  if (!cmSystemTools::ReadSymlink(filename, result)) {
    status.SetError(cmStrCat(
      "READ_SYMLINK requested of path that is not a symlink:\n  ", filename));
    return false;
  }

  status.GetMakefile().AddDefinition(outputVariable, result);

  return true;
}